

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

void __thiscall
spirv_cross::SmallVector<spirv_cross::SPIRBlock::Phi,_8UL>::reserve
          (SmallVector<spirv_cross::SPIRBlock::Phi,_8UL> *this,size_t count)

{
  Phi *pPVar1;
  ulong uVar2;
  Phi *pPVar3;
  long lVar4;
  ulong uVar5;
  
  if (count < 0x1555555555555556) {
    uVar2 = this->buffer_capacity;
    if (uVar2 < count) {
      uVar5 = 8;
      if (8 < uVar2) {
        uVar5 = uVar2;
      }
      do {
        uVar2 = uVar5;
        uVar5 = uVar2 * 2;
      } while (uVar2 < count);
      if (uVar2 < 9) {
        pPVar3 = (Phi *)&this->stack_storage;
      }
      else {
        pPVar3 = (Phi *)malloc(uVar2 * 0xc);
      }
      if (pPVar3 == (Phi *)0x0) goto LAB_002b6cc8;
      if ((pPVar3 != (this->super_VectorView<spirv_cross::SPIRBlock::Phi>).ptr) &&
         ((this->super_VectorView<spirv_cross::SPIRBlock::Phi>).buffer_size != 0)) {
        lVar4 = 0;
        uVar5 = 0;
        do {
          pPVar1 = (this->super_VectorView<spirv_cross::SPIRBlock::Phi>).ptr;
          *(undefined4 *)((long)&(pPVar3->function_variable).id + lVar4) =
               *(undefined4 *)((long)&(pPVar1->function_variable).id + lVar4);
          *(undefined8 *)((long)&(pPVar3->local_variable).id + lVar4) =
               *(undefined8 *)((long)&(pPVar1->local_variable).id + lVar4);
          uVar5 = uVar5 + 1;
          lVar4 = lVar4 + 0xc;
        } while (uVar5 < (this->super_VectorView<spirv_cross::SPIRBlock::Phi>).buffer_size);
      }
      pPVar1 = (this->super_VectorView<spirv_cross::SPIRBlock::Phi>).ptr;
      if (pPVar1 != (Phi *)&this->stack_storage) {
        free(pPVar1);
      }
      (this->super_VectorView<spirv_cross::SPIRBlock::Phi>).ptr = pPVar3;
      this->buffer_capacity = uVar2;
    }
    return;
  }
LAB_002b6cc8:
  ::std::terminate();
}

Assistant:

void reserve(size_t count) SPIRV_CROSS_NOEXCEPT
	{
		if ((count > (std::numeric_limits<size_t>::max)() / sizeof(T)) ||
		    (count > (std::numeric_limits<size_t>::max)() / 2))
		{
			// Only way this should ever happen is with garbage input, terminate.
			std::terminate();
		}

		if (count > buffer_capacity)
		{
			size_t target_capacity = buffer_capacity;
			if (target_capacity == 0)
				target_capacity = 1;

			// Weird parens works around macro issues on Windows if NOMINMAX is not used.
			target_capacity = (std::max)(target_capacity, N);

			// Need to ensure there is a POT value of target capacity which is larger than count,
			// otherwise this will overflow.
			while (target_capacity < count)
				target_capacity <<= 1u;

			T *new_buffer =
			    target_capacity > N ? static_cast<T *>(malloc(target_capacity * sizeof(T))) : stack_storage.data();

			// If we actually fail this malloc, we are hosed anyways, there is no reason to attempt recovery.
			if (!new_buffer)
				std::terminate();

			// In case for some reason two allocations both come from same stack.
			if (new_buffer != this->ptr)
			{
				// We don't deal with types which can throw in move constructor.
				for (size_t i = 0; i < this->buffer_size; i++)
				{
					new (&new_buffer[i]) T(std::move(this->ptr[i]));
					this->ptr[i].~T();
				}
			}

			if (this->ptr != stack_storage.data())
				free(this->ptr);
			this->ptr = new_buffer;
			buffer_capacity = target_capacity;
		}
	}